

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_recursive_cte.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalRecursiveCTE *op)

{
  vector<duckdb::LogicalType,_true> *__x;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  idx_t *__k;
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var3;
  mapped_type *pmVar4;
  reference pvVar5;
  type pLVar6;
  PhysicalOperator *pPVar7;
  reference this_01;
  pointer this_02;
  BoundReferenceExpression *pBVar8;
  mapped_type *pmVar9;
  const_reference other;
  __node_base_ptr p_Var10;
  Binder *this_03;
  pointer pBVar11;
  PhysicalOperator *pPVar12;
  pointer pPVar13;
  PhysicalRecursiveCTE *pPVar14;
  __node_base_ptr p_Var15;
  size_type __n;
  _Hash_node_base *local_2e0;
  long *local_2d8;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  first_aggregate;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  first_children;
  FunctionBinder function_binder;
  shared_ptr<duckdb::ColumnDataCollection,_true> working_table;
  vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
  local_278;
  vector<unsigned_long,_true> distinct_idx;
  vector<unsigned_long,_true> payload_idx;
  shared_ptr<duckdb::ColumnDataCollection,_true> recurring_table;
  vector<duckdb::LogicalType,_true> distinct_types;
  vector<duckdb::LogicalType,_true> payload_types;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_1b8;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  group_by_references;
  AggregateFunction local_160;
  
  __x = &(op->super_LogicalOperator).types;
  group_by_references._M_h._M_buckets = (__buckets_ptr)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&group_by_references._M_h._M_bucket_count
             ,(ColumnDataCollection **)&group_by_references,
             (allocator<duckdb::ColumnDataCollection> *)&first_children,this->context,__x);
  working_table.internal.
  super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)group_by_references._M_h._M_buckets;
  working_table.internal.
  super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)group_by_references._M_h._M_bucket_count;
  if (group_by_references._M_h._M_bucket_count != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(group_by_references._M_h._M_bucket_count + 8) =
           *(int *)(group_by_references._M_h._M_bucket_count + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(group_by_references._M_h._M_bucket_count + 8) =
           *(int *)(group_by_references._M_h._M_bucket_count + 8) + 1;
    }
  }
  if (group_by_references._M_h._M_bucket_count != 0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               group_by_references._M_h._M_bucket_count);
  }
  __k = &op->table_index;
  pmVar4 = ::std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->recursive_cte_tables,__k);
  shared_ptr<duckdb::ColumnDataCollection,_true>::operator=(pmVar4,&working_table);
  this_00 = &(op->super_LogicalOperator).children;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar5);
  pPVar7 = CreatePlan(this,pLVar6);
  if ((op->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (op->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](this_00,1);
    pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar5);
    pPVar12 = CreatePlan(this,pLVar6);
    pPVar13 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(&this->physical_plan);
    pPVar7 = PhysicalPlan::
             Make<duckdb::PhysicalRecursiveCTE,std::__cxx11::string&,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,bool&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,unsigned_long&>
                       (pPVar13,&op->ctename,__k,__x,(bool *)&(op->super_LogicalOperator).field_0x61
                        ,pPVar7,pPVar12,&(op->super_LogicalOperator).estimated_cardinality);
    pPVar14 = PhysicalOperator::Cast<duckdb::PhysicalRecursiveCTE>(pPVar7);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pPVar14->distinct_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &__x->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    shared_ptr<duckdb::ColumnDataCollection,_true>::operator=
              (&pPVar14->working_table,&working_table);
  }
  else {
    payload_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    payload_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    payload_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    distinct_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    distinct_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    distinct_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_278.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    group_by_references._M_h._M_buckets = &group_by_references._M_h._M_single_bucket;
    group_by_references._M_h._M_bucket_count = 1;
    group_by_references._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    group_by_references._M_h._M_element_count = 0;
    group_by_references._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    group_by_references._M_h._M_rehash_policy._M_next_resize = 0;
    group_by_references._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if ((op->key_targets).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (op->key_targets).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&op->key_targets,__n);
        this_02 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_01);
        pBVar8 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                           (&this_02->super_BaseExpression);
        pmVar9 = ::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&group_by_references,&pBVar8->index);
        *pmVar9 = __n;
        __n = __n + 1;
      } while (__n < (ulong)((long)(op->key_targets).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(op->key_targets).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_2e0 = (_Hash_node_base *)0x0;
    if ((pPVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pPVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        other = vector<duckdb::LogicalType,_true>::operator[](&pPVar7->types,(size_type)local_2e0);
        LogicalType::LogicalType((LogicalType *)&recurring_table,other);
        p_Var1 = group_by_references._M_h._M_buckets
                 [(ulong)local_2e0 % group_by_references._M_h._M_bucket_count];
        p_Var10 = (__node_base_ptr)0x0;
        if ((p_Var1 != (__node_base_ptr)0x0) &&
           (p_Var10 = p_Var1, p_Var15 = p_Var1->_M_nxt, local_2e0 != p_Var1->_M_nxt[1]._M_nxt)) {
          while (p_Var2 = p_Var15->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
            p_Var10 = (__node_base_ptr)0x0;
            if (((ulong)p_Var2[1]._M_nxt % group_by_references._M_h._M_bucket_count !=
                 (ulong)local_2e0 % group_by_references._M_h._M_bucket_count) ||
               (p_Var10 = p_Var15, p_Var15 = p_Var2, local_2e0 == p_Var2[1]._M_nxt))
            goto LAB_015b776c;
          }
          p_Var10 = (__node_base_ptr)0x0;
        }
LAB_015b776c:
        if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
          this_03 = (Binder *)operator_new(0x60);
          LogicalType::LogicalType((LogicalType *)&first_children,(LogicalType *)&recurring_table);
          BoundReferenceExpression::BoundReferenceExpression
                    ((BoundReferenceExpression *)this_03,(LogicalType *)&first_children,0);
          LogicalType::~LogicalType((LogicalType *)&first_children);
          first_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          first_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          first_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          function_binder.binder.ptr = this_03;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&first_children,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&function_binder);
          if (function_binder.binder.ptr != (Binder *)0x0) {
            (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&((((function_binder.binder.ptr)->
                                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal
                                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               )->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))
                      ->_M_pi)();
          }
          FunctionBinder::FunctionBinder(&function_binder,this->context);
          LastFunctionGetter::GetFunction(&local_160,(LogicalType *)&recurring_table);
          local_1b8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               first_children.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1b8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               first_children.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1b8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               first_children.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          first_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          first_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          first_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2d8 = (long *)0x0;
          FunctionBinder::BindAggregateFunction
                    ((FunctionBinder *)&first_aggregate,(AggregateFunction *)&function_binder,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)&local_160,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_1b8,(AggregateType)&local_2d8);
          if (local_2d8 != (long *)0x0) {
            (**(code **)(*local_2d8 + 8))();
          }
          local_2d8 = (long *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector(&local_1b8);
          local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
               (_func_int **)&PTR__AggregateFunction_02476990;
          if (local_160.function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_160.function_info.internal.
                       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
          pBVar11 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                    ::operator->(&first_aggregate);
          _Var3._M_head_impl =
               (pBVar11->order_bys).
               super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
               .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
          (pBVar11->order_bys).
          super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
          .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
               (BoundOrderModifier *)0x0;
          if (_Var3._M_head_impl != (BoundOrderModifier *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BoundResultModifier + 8))();
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&payload_types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     (LogicalType *)&recurring_table);
          if (payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&payload_idx,
                       (iterator)
                       payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_long *)&local_2e0);
          }
          else {
            *payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_2e0;
            payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,std::default_delete<duckdb::BoundAggregateExpression>,true>>>
                      *)&local_278,&first_aggregate);
          if (first_aggregate.
              super_unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::BoundAggregateExpression_*,_std::default_delete<duckdb::BoundAggregateExpression>_>
              .super__Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)first_aggregate.
                                  super_unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::BoundAggregateExpression_*,_std::default_delete<duckdb::BoundAggregateExpression>_>
                                  .super__Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false>.
                                  _M_head_impl + 8))();
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&first_children);
        }
        else {
          if (distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&distinct_idx,
                       (iterator)
                       distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_long *)&local_2e0);
          }
          else {
            *distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_2e0;
            distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&distinct_types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     (LogicalType *)&recurring_table);
        }
        LogicalType::~LogicalType((LogicalType *)&recurring_table);
        local_2e0 = (_Hash_node_base *)((long)&local_2e0->_M_nxt + 1);
      } while (local_2e0 <
               (_Hash_node_base *)
               (((long)(pPVar7->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar7->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
    }
    first_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::ColumnDataCollection,std::allocator<duckdb::ColumnDataCollection>,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &first_children.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(ColumnDataCollection **)&first_children,
               (allocator<duckdb::ColumnDataCollection> *)&function_binder,this->context,__x);
    recurring_table.internal.
    super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         first_children.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    recurring_table.internal.
    super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         first_children.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (first_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&first_children.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[1].
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             *(int *)&first_children.
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[1].
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 1;
        UNLOCK();
      }
      else {
        *(int *)&first_children.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[1].
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             *(int *)&first_children.
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[1].
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 1;
      }
    }
    if (first_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 first_children.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->recurring_cte_tables,__k);
    shared_ptr<duckdb::ColumnDataCollection,_true>::operator=(pmVar4,&recurring_table);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](this_00,1);
    pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar5);
    pPVar12 = CreatePlan(this,pLVar6);
    pPVar13 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(&this->physical_plan);
    pPVar7 = PhysicalPlan::
             Make<duckdb::PhysicalRecursiveCTE,std::__cxx11::string&,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,bool&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,unsigned_long&>
                       (pPVar13,&op->ctename,__k,__x,(bool *)&(op->super_LogicalOperator).field_0x61
                        ,pPVar7,pPVar12,&(op->super_LogicalOperator).estimated_cardinality);
    pPVar14 = PhysicalOperator::Cast<duckdb::PhysicalRecursiveCTE>(pPVar7);
    pPVar14->using_key = true;
    first_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(pPVar14->payload_aggregates).
                  super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    first_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(pPVar14->payload_aggregates).
                  super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    first_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(pPVar14->payload_aggregates).
                  super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pPVar14->payload_aggregates).
    super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_278.
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pPVar14->payload_aggregates).
    super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_278.
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pPVar14->payload_aggregates).
    super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_278.
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_278.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
               *)&first_children);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pPVar14->distinct_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               &distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pPVar14->distinct_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &distinct_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pPVar14->payload_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               &payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pPVar14->payload_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &payload_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    pPVar14->ref_recurring = (bool)(op->super_LogicalOperator).field_0x62;
    shared_ptr<duckdb::ColumnDataCollection,_true>::operator=
              (&pPVar14->working_table,&working_table);
    shared_ptr<duckdb::ColumnDataCollection,_true>::operator=
              (&pPVar14->recurring_table,&recurring_table);
    if (recurring_table.internal.
        super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (recurring_table.internal.
                 super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&group_by_references._M_h);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
    ::~vector(&local_278);
    if (distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(distinct_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(payload_idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&distinct_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&payload_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  if (working_table.internal.
      super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (working_table.internal.
               super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return pPVar7;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalRecursiveCTE &op) {
	D_ASSERT(op.children.size() == 2);

	// Create the working_table that the PhysicalRecursiveCTE will use for evaluation.
	auto working_table = make_shared_ptr<ColumnDataCollection>(context, op.types);

	// Add the ColumnDataCollection to the context of this PhysicalPlanGenerator
	recursive_cte_tables[op.table_index] = working_table;

	auto &left = CreatePlan(*op.children[0]);

	// If the logical operator has no key targets or all columns are referenced,
	// then we create a normal recursive CTE operator.
	if (op.key_targets.empty()) {
		auto &right = CreatePlan(*op.children[1]);
		auto &cte = Make<PhysicalRecursiveCTE>(op.ctename, op.table_index, op.types, op.union_all, left, right,
		                                       op.estimated_cardinality);
		auto &cast_cte = cte.Cast<PhysicalRecursiveCTE>();
		cast_cte.distinct_types = op.types;
		cast_cte.working_table = working_table;
		return cte;
	}

	vector<LogicalType> payload_types, distinct_types;
	vector<idx_t> payload_idx, distinct_idx;
	vector<unique_ptr<BoundAggregateExpression>> payload_aggregates;

	// create a group for each target, these are the columns that should be grouped
	unordered_map<idx_t, idx_t> group_by_references;
	for (idx_t i = 0; i < op.key_targets.size(); i++) {
		auto &target = op.key_targets[i];
		D_ASSERT(target->type == ExpressionType::BOUND_REF);
		auto &bound_ref = target->Cast<BoundReferenceExpression>();
		group_by_references[bound_ref.index] = i;
	}

	/*
	 * iterate over all types
	 * 		Differentiate the occurrence of the column in the key clause.
	 */
	auto &types = left.GetTypes();
	for (idx_t i = 0; i < types.size(); ++i) {
		auto logical_type = types[i];
		// Check if we can directly refer to a group, or if we need to push an aggregate with LAST
		auto entry = group_by_references.find(i);
		if (entry != group_by_references.end()) {
			// Column has a key, note the column index to make a distinction on it
			distinct_idx.emplace_back(i);
			distinct_types.push_back(logical_type);
		} else {
			// Column is not in the key clause, so we need to create an aggregate
			auto bound = make_uniq<BoundReferenceExpression>(logical_type, 0U);

			vector<unique_ptr<Expression>> first_children;
			first_children.push_back(std::move(bound));

			FunctionBinder function_binder(context);
			auto first_aggregate =
			    function_binder.BindAggregateFunction(LastFunctionGetter::GetFunction(logical_type),
			                                          std::move(first_children), nullptr, AggregateType::NON_DISTINCT);
			first_aggregate->order_bys = nullptr;

			payload_types.push_back(logical_type);
			payload_idx.emplace_back(i);
			payload_aggregates.push_back(std::move(first_aggregate));
		}
	}

	// If the key variant has been used, a recurring table will be created.
	auto recurring_table = make_shared_ptr<ColumnDataCollection>(context, op.types);
	recurring_cte_tables[op.table_index] = recurring_table;

	auto &right = CreatePlan(*op.children[1]);
	auto &cte = Make<PhysicalRecursiveCTE>(op.ctename, op.table_index, op.types, op.union_all, left, right,
	                                       op.estimated_cardinality);
	auto &cast_cte = cte.Cast<PhysicalRecursiveCTE>();
	cast_cte.using_key = true;
	cast_cte.payload_aggregates = std::move(payload_aggregates);
	cast_cte.distinct_idx = distinct_idx;
	cast_cte.distinct_types = distinct_types;
	cast_cte.payload_idx = payload_idx;
	cast_cte.payload_types = payload_types;
	cast_cte.ref_recurring = op.ref_recurring;
	cast_cte.working_table = working_table;
	cast_cte.recurring_table = recurring_table;
	return cte;
}